

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

void ZSTD_reduceIndex(ZSTD_CCtx *zc,U32 reducerValue)

{
  uint *puVar1;
  U32 *pUVar2;
  ZSTD_strategy ZVar3;
  U32 UVar4;
  U32 *pUVar5;
  int nbRows;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  iVar7 = 1 << ((byte)(zc->appliedParams).cParams.hashLog & 0x1f);
  iVar6 = iVar7 + 0xf;
  if (-1 < iVar7) {
    iVar6 = iVar7;
  }
  if (0xf < iVar7) {
    pUVar5 = (zc->blockState).matchState.hashTable;
    iVar7 = 0;
    iVar8 = 0;
    do {
      lVar9 = 0;
      do {
        puVar1 = pUVar5 + iVar7 + lVar9;
        uVar10 = puVar1[1];
        uVar11 = puVar1[2];
        uVar12 = puVar1[3];
        pUVar2 = pUVar5 + iVar7 + lVar9;
        *pUVar2 = *puVar1 - reducerValue &
                  -(uint)((int)(reducerValue ^ 0x80000000) < (int)(*puVar1 ^ 0x80000000));
        pUVar2[1] = uVar10 - reducerValue &
                    -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar10 ^ 0x80000000));
        pUVar2[2] = uVar11 - reducerValue &
                    -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
        pUVar2[3] = uVar12 - reducerValue &
                    -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar12 ^ 0x80000000));
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x10);
      iVar7 = iVar7 + 0x10;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar6 >> 4);
  }
  ZVar3 = (zc->appliedParams).cParams.strategy;
  if (ZVar3 != ZSTD_fast) {
    iVar7 = 1 << ((byte)(zc->appliedParams).cParams.chainLog & 0x1f);
    iVar6 = iVar7 + 0xf;
    if (-1 < iVar7) {
      iVar6 = iVar7;
    }
    pUVar5 = (zc->blockState).matchState.chainTable;
    if (ZVar3 == ZSTD_btlazy2) {
      if (0xf < iVar7) {
        iVar7 = 0;
        iVar8 = 0;
        do {
          lVar9 = 0;
          do {
            pUVar2 = pUVar5 + iVar7 + lVar9;
            uVar10 = (-(uint)(*pUVar2 == 1) & reducerValue) + *pUVar2;
            uVar11 = (-(uint)(pUVar2[1] == 1) & reducerValue) + pUVar2[1];
            uVar12 = (-(uint)(pUVar2[2] == 1) & reducerValue) + pUVar2[2];
            uVar13 = (-(uint)(pUVar2[3] == 1) & reducerValue) + pUVar2[3];
            pUVar2 = pUVar5 + iVar7 + lVar9;
            *pUVar2 = -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar10 ^ 0x80000000)) &
                      uVar10 - reducerValue;
            pUVar2[1] = -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar11 ^ 0x80000000)) &
                        uVar11 - reducerValue;
            pUVar2[2] = -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar12 ^ 0x80000000)) &
                        uVar12 - reducerValue;
            pUVar2[3] = -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar13 ^ 0x80000000)) &
                        uVar13 - reducerValue;
            lVar9 = lVar9 + 4;
          } while (lVar9 != 0x10);
          iVar7 = iVar7 + 0x10;
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar6 >> 4);
      }
    }
    else if (0xf < iVar7) {
      iVar7 = 0;
      iVar8 = 0;
      do {
        lVar9 = 0;
        do {
          puVar1 = pUVar5 + iVar7 + lVar9;
          uVar10 = puVar1[1];
          uVar11 = puVar1[2];
          uVar12 = puVar1[3];
          pUVar2 = pUVar5 + iVar7 + lVar9;
          *pUVar2 = *puVar1 - reducerValue &
                    -(uint)((int)(reducerValue ^ 0x80000000) < (int)(*puVar1 ^ 0x80000000));
          pUVar2[1] = uVar10 - reducerValue &
                      -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar10 ^ 0x80000000));
          pUVar2[2] = uVar11 - reducerValue &
                      -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
          pUVar2[3] = uVar12 - reducerValue &
                      -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar12 ^ 0x80000000));
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x10);
        iVar7 = iVar7 + 0x10;
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar6 >> 4);
    }
  }
  UVar4 = (zc->blockState).matchState.hashLog3;
  if (UVar4 != 0) {
    iVar7 = 1 << ((byte)UVar4 & 0x1f);
    iVar6 = iVar7 + 0xf;
    if (-1 < iVar7) {
      iVar6 = iVar7;
    }
    if (0xf < iVar7) {
      pUVar5 = (zc->blockState).matchState.hashTable3;
      iVar7 = 0;
      iVar8 = 0;
      do {
        lVar9 = 0;
        do {
          puVar1 = pUVar5 + iVar7 + lVar9;
          uVar10 = puVar1[1];
          uVar11 = puVar1[2];
          uVar12 = puVar1[3];
          pUVar2 = pUVar5 + iVar7 + lVar9;
          *pUVar2 = *puVar1 - reducerValue &
                    -(uint)((int)(reducerValue ^ 0x80000000) < (int)(*puVar1 ^ 0x80000000));
          pUVar2[1] = uVar10 - reducerValue &
                      -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar10 ^ 0x80000000));
          pUVar2[2] = uVar11 - reducerValue &
                      -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar11 ^ 0x80000000));
          pUVar2[3] = uVar12 - reducerValue &
                      -(uint)((int)(reducerValue ^ 0x80000000) < (int)(uVar12 ^ 0x80000000));
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x10);
        iVar7 = iVar7 + 0x10;
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar6 >> 4);
    }
  }
  return;
}

Assistant:

static void ZSTD_reduceIndex (ZSTD_CCtx* zc, const U32 reducerValue)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    {   U32 const hSize = (U32)1 << zc->appliedParams.cParams.hashLog;
        ZSTD_reduceTable(ms->hashTable, hSize, reducerValue);
    }

    if (zc->appliedParams.cParams.strategy != ZSTD_fast) {
        U32 const chainSize = (U32)1 << zc->appliedParams.cParams.chainLog;
        if (zc->appliedParams.cParams.strategy == ZSTD_btlazy2)
            ZSTD_reduceTable_btlazy2(ms->chainTable, chainSize, reducerValue);
        else
            ZSTD_reduceTable(ms->chainTable, chainSize, reducerValue);
    }

    if (ms->hashLog3) {
        U32 const h3Size = (U32)1 << ms->hashLog3;
        ZSTD_reduceTable(ms->hashTable3, h3Size, reducerValue);
    }
}